

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O0

int Test_N_VMaxNormLocal(N_Vector X,sunindextype local_length,int myid)

{
  uint in_EDX;
  N_Vector in_RDI;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  sunrealtype myidp1;
  sunrealtype ans;
  double maxt;
  double stop_time;
  double start_time;
  int failure;
  int fails;
  sunindextype in_stack_ffffffffffffff98;
  N_Vector in_stack_ffffffffffffffa0;
  int local_4c;
  int local_18;
  
  local_18 = 0;
  dVar1 = (double)(int)(in_EDX + 1);
  N_VConst(0xbfe0000000000000,in_RDI);
  set_element(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,5.47024048353324e-318);
  dVar2 = get_time();
  dVar3 = (double)N_VMaxNormLocal(in_RDI);
  sync_device(in_RDI);
  dVar4 = get_time();
  if (0.0 <= dVar3) {
    dVar5 = sqrt(2.220446049250313e-16);
    local_4c = SUNRCompareTol(dVar3,dVar1,SUB84(dVar5,0));
  }
  else {
    local_4c = 1;
  }
  if (local_4c == 0) {
    if (in_EDX == 0) {
      printf("PASSED test -- N_VMaxNormLocal\n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VMaxNormLocal, Proc %d\n",(ulong)in_EDX);
    local_18 = 1;
  }
  dVar1 = max_time(in_RDI,dVar4 - dVar2);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar1,"N_VMaxNormLocal");
  }
  return local_18;
}

Assistant:

int Test_N_VMaxNormLocal(N_Vector X, sunindextype local_length, int myid)
{
  int fails = 0, failure = 0;
  double start_time, stop_time, maxt;
  sunrealtype ans, myidp1;

  /* fill vector data */
  myidp1 = (sunrealtype)(myid + 1);
  N_VConst(NEG_HALF, X);
  set_element(X, local_length - 1, -myidp1);

  start_time = get_time();
  ans        = N_VMaxNormLocal(X);
  sync_device(X);
  stop_time = get_time();

  /* ans should equal myidp1 */
  failure =
    (ans < ZERO) ? 1 : SUNRCompareTol(ans, myidp1, SUNRsqrt(SUN_UNIT_ROUNDOFF));

  if (failure)
  {
    printf(">>> FAILED test -- N_VMaxNormLocal, Proc %d\n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VMaxNormLocal\n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VMaxNormLocal", maxt);

  return (fails);
}